

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiMask.cpp
# Opt level: O0

void __thiscall
amrex::MultiMask::MultiMask(MultiMask *this,BoxArray *ba,DistributionMapping *dm,int ncomp)

{
  undefined4 in_ECX;
  undefined4 in_stack_ffffffffffffff90;
  undefined8 *puVar1;
  DistributionMapping *in_stack_ffffffffffffffa0;
  BoxArray *in_stack_ffffffffffffffa8;
  FabFactory<amrex::Mask> this_00;
  undefined8 local_48;
  FabFactory<amrex::Mask> *factory;
  
  local_48 = 0;
  factory = (FabFactory<amrex::Mask> *)0x0;
  puVar1 = &local_48;
  MFInfo::MFInfo((MFInfo *)0x162c3a7);
  this_00._vptr_FabFactory = (_func_int **)0x0;
  DefaultFabFactory<amrex::Mask>::DefaultFabFactory
            ((DefaultFabFactory<amrex::Mask> *)&stack0xffffffffffffffb0);
  FabArray<amrex::Mask>::FabArray
            ((FabArray<amrex::Mask> *)this_00._vptr_FabFactory,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,(int)((ulong)puVar1 >> 0x20),(int)puVar1,
             (MFInfo *)CONCAT44(in_ECX,in_stack_ffffffffffffff90),factory);
  DefaultFabFactory<amrex::Mask>::~DefaultFabFactory((DefaultFabFactory<amrex::Mask> *)0x162c3f6);
  MFInfo::~MFInfo((MFInfo *)0x162c400);
  return;
}

Assistant:

MultiMask::MultiMask (const BoxArray& ba, const DistributionMapping& dm, int ncomp)
    : m_fa(ba, dm, ncomp, 0, MFInfo(), DefaultFabFactory<Mask>())
{ }